

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  string_view name_00;
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  undefined1 local_178 [8];
  string_view metadata_name;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_160;
  size_t local_150;
  char *local_148;
  Enum local_13c;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_138;
  size_t local_128;
  char *local_120;
  Enum local_118;
  Enum local_114;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_110;
  size_t local_100;
  char *local_f8;
  Enum local_ec;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e8;
  size_t local_d8;
  char *local_d0;
  Enum local_c4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c0;
  size_t local_b0;
  char *local_a8;
  uint local_9c;
  size_t local_98;
  size_t local_90;
  Enum local_84;
  undefined1 local_80 [8];
  ValueRestoreGuard<wabt::BinaryReaderDelegate::State,_&wabt::(anonymous_namespace)::BinaryReader::state_>
  guard_1;
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_> guard
  ;
  undefined1 local_38 [8];
  string_view section_name;
  Offset section_size_local;
  Index section_index_local;
  BinaryReader *this_local;
  
  section_name._M_str = (char *)section_size;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
  RVar2 = ReadStr(this,(string_view *)local_38,"section name");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                          (this->delegate_,(ulong)section_index,section_name._M_str,local_38,
                           section_name._M_len);
  bVar1 = Succeeded(RVar2);
  if (!bVar1) {
    PrintError(this,"BeginCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                     *)&guard_1.previous_value_.offset,this);
  this->reading_custom_section_ = true;
  ValueRestoreGuard<wabt::BinaryReaderDelegate::State,_&wabt::(anonymous_namespace)::BinaryReader::state_>
  ::ValueRestoreGuard((ValueRestoreGuard<wabt::BinaryReaderDelegate::State,_&wabt::(anonymous_namespace)::BinaryReader::state_>
                       *)local_80,this);
  local_98 = (size_t)local_38;
  local_90 = section_name._M_len;
  name_00._M_str = (char *)section_name._M_len;
  name_00._M_len = (size_t)local_38;
  local_84 = (Enum)ReadGenericCustomSection(this,name_00,(Offset)section_name._M_str);
  bVar1 = Failed((Result)local_84);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  local_9c = (uint)bVar1;
  ValueRestoreGuard<wabt::BinaryReaderDelegate::State,_&wabt::(anonymous_namespace)::BinaryReader::state_>
  ::~ValueRestoreGuard
            ((ValueRestoreGuard<wabt::BinaryReaderDelegate::State,_&wabt::(anonymous_namespace)::BinaryReader::state_>
              *)local_80);
  if (local_9c != 0) goto LAB_001321fc;
  if ((this->options_->read_debug_names & 1U) == 0) {
LAB_00131db6:
    local_d8 = (size_t)local_38;
    local_d0 = (char *)section_name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e8,"dylink.0");
    __x_02._M_str = local_d0;
    __x_02._M_len = local_d8;
    bVar1 = std::operator==(__x_02,local_e8);
    if (bVar1) {
      local_ec = (Enum)ReadDylink0Section(this,(Offset)section_name._M_str);
      bVar1 = Failed((Result)local_ec);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_9c = 1;
        goto LAB_001321fc;
      }
    }
    else {
      local_100 = (size_t)local_38;
      local_f8 = (char *)section_name._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,"dylink");
      __x_01._M_str = local_f8;
      __x_01._M_len = local_100;
      bVar1 = std::operator==(__x_01,local_110);
      if (bVar1) {
        local_114 = (Enum)ReadDylinkSection(this,(Offset)section_name._M_str);
        bVar1 = Failed((Result)local_114);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_9c = 1;
          goto LAB_001321fc;
        }
      }
      else {
        sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_38,"reloc",0);
        if (sVar3 == 0) {
          local_118 = (Enum)ReadRelocSection(this,(Offset)section_name._M_str);
          bVar1 = Failed((Result)local_118);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            local_9c = 1;
            goto LAB_001321fc;
          }
        }
        else {
          local_128 = (size_t)local_38;
          local_120 = (char *)section_name._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_138,"target_features");
          __x_00._M_str = local_120;
          __x_00._M_len = local_128;
          bVar1 = std::operator==(__x_00,local_138);
          if (bVar1) {
            local_13c = (Enum)ReadTargetFeaturesSections(this,(Offset)section_name._M_str);
            bVar1 = Failed((Result)local_13c);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              local_9c = 1;
              goto LAB_001321fc;
            }
          }
          else {
            local_150 = (size_t)local_38;
            local_148 = (char *)section_name._M_len;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_160,"linking");
            __x._M_str = local_148;
            __x._M_len = local_150;
            bVar1 = std::operator==(__x,local_160);
            if (bVar1) {
              metadata_name._M_str._4_4_ = ReadLinkingSection(this,(Offset)section_name._M_str);
              bVar1 = Failed(metadata_name._M_str._4_4_);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                local_9c = 1;
                goto LAB_001321fc;
              }
            }
            else {
              bVar1 = Features::code_metadata_enabled(&this->options_->features);
              if ((bVar1) &&
                 (sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_38,
                                     "metadata.code.",0), sVar3 == 0)) {
                local_178 = local_38;
                metadata_name._M_len = section_name._M_len;
                std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_178,0xe);
                name._M_str = (char *)metadata_name._M_len;
                name._M_len = (size_t)local_178;
                RVar2 = ReadCodeMetadataSection(this,name,(Offset)section_name._M_str);
                bVar1 = Failed(RVar2);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  local_9c = 1;
                  goto LAB_001321fc;
                }
              }
              else {
                (this->state_).offset = this->read_end_;
              }
            }
          }
        }
      }
    }
  }
  else {
    local_b0 = (size_t)local_38;
    local_a8 = (char *)section_name._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"name");
    __x_03._M_str = local_a8;
    __x_03._M_len = local_b0;
    bVar1 = std::operator==(__x_03,local_c0);
    if (!bVar1) goto LAB_00131db6;
    local_c4 = (Enum)ReadNameSection(this,(Offset)section_name._M_str);
    bVar1 = Failed((Result)local_c4);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_9c = 1;
      goto LAB_001321fc;
    }
    this->did_read_names_section_ = true;
  }
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
  bVar1 = Succeeded(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
    local_9c = 1;
  }
  else {
    PrintError(this,"EndCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
    local_9c = 1;
  }
LAB_001321fc:
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ~ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                      *)&guard_1.previous_value_.offset);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  {
    // Backtrack parser when scope ends
    ValueRestoreGuard<BinaryReaderDelegate::State, &BinaryReader::state_> guard(
        this);
    CHECK_RESULT(ReadGenericCustomSection(section_name, section_size));
  }

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // Skip. This is a generic custom section, and is handled above.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}